

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O0

void __thiscall CFFPrimitiveWriter::SetStream(CFFPrimitiveWriter *this,IByteWriter *inCFFOutput)

{
  IByteWriter *inCFFOutput_local;
  CFFPrimitiveWriter *this_local;
  
  this->mCFFOutput = inCFFOutput;
  if (inCFFOutput == (IByteWriter *)0x0) {
    this->mInternalState = eFailure;
  }
  else {
    this->mCurrentOffsize = '\x01';
    this->mInternalState = eSuccess;
  }
  return;
}

Assistant:

void CFFPrimitiveWriter::SetStream(IByteWriter* inCFFOutput)
{
	mCFFOutput = inCFFOutput;
	if(inCFFOutput)
	{
		mCurrentOffsize = 1;
		mInternalState = PDFHummus::eSuccess;
	}
	else
	{
		mInternalState = PDFHummus::eFailure;
	}
}